

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O1

void __thiscall CppUnit::PlugInManager::unload(PlugInManager *this,PlugInInfo *plugIn)

{
  CppUnitTestPlugIn *pCVar1;
  DynamicLibraryManager *this_00;
  TestFactoryRegistry *pTVar2;
  string local_38;
  
  pCVar1 = plugIn->m_interface;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"All Tests","");
  pTVar2 = TestFactoryRegistry::getRegistry(&local_38);
  (*pCVar1->_vptr_CppUnitTestPlugIn[5])(pCVar1,pTVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  this_00 = plugIn->m_manager;
  if (this_00 != (DynamicLibraryManager *)0x0) {
    DynamicLibraryManager::~DynamicLibraryManager(this_00);
    operator_delete(this_00,0x28);
  }
  return;
}

Assistant:

void 
PlugInManager::unload( PlugInInfo &plugIn )
{
  try
  {
    plugIn.m_interface->uninitialize( &TestFactoryRegistry::getRegistry() );
    delete plugIn.m_manager;
  }
  catch (...)
  {
    delete plugIn.m_manager;
    plugIn.m_manager = NULL;
    throw;
  }
}